

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZSavable.h
# Opt level: O0

TPZSavable * __thiscall
TPZRestoreClass<TPZStructMatrixOR<std::complex<double>_>_>::Restore
          (TPZRestoreClass<TPZStructMatrixOR<std::complex<double>_>_> *this)

{
  long *plVar1;
  TPZStructMatrixOR<std::complex<double>_> *unaff_retaddr;
  TPZStructMatrixOR<std::complex<double>_> *ptr;
  undefined8 local_30;
  
  plVar1 = (long *)operator_new(0x18);
  TPZStructMatrixOR<std::complex<double>_>::TPZStructMatrixOR(unaff_retaddr);
  local_30 = (TPZSavable *)0x0;
  if (plVar1 != (long *)0x0) {
    local_30 = (TPZSavable *)((long)plVar1 + *(long *)(*plVar1 + -0x68));
  }
  return local_30;
}

Assistant:

virtual TPZSavable *Restore() override {
        T *ptr = new T;
        return ptr;
    }